

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,false>>
::internal_emplace<int_const&>
          (btree<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,false>>
           *this,iterator iter,int *args)

{
  int iVar1;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *this_00;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  bVar2;
  ulong uVar3;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  *pbVar4;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
  bVar5;
  byte bVar6;
  ulong uVar7;
  allocator_type *alloc;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar8;
  iterator iVar9;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_38;
  
  local_38.node = iter.node;
  local_38.position = iter.position;
  if (((undefined1  [16])iter & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    if (local_38.node[0xb] ==
        (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
         )0x0) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
      ::operator--(&local_38);
      local_38.position = local_38.position + 1;
    }
    if (((ulong)local_38.node & 7) == 0) {
      bVar2 = local_38.node[0xb];
      uVar7 = (ulong)(byte)bVar2;
      bVar5 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
               )0x3d;
      if (bVar2 != (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    )0x0) {
        bVar5 = bVar2;
      }
      if (local_38.node[10] == bVar5) {
        if ((byte)bVar5 < 0x3d) {
          if (local_38.node !=
              *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                **)this) {
            __assert_fail("iter.node == root()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xc27,
                          "iterator phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>, Args = <const int &>]"
                         );
          }
          bVar6 = 0x3d;
          if ((byte)((char)bVar5 * '\x02') < 0x3d) {
            bVar6 = (char)bVar5 * '\x02';
          }
          local_38.node =
               btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
               ::new_leaf_root_node
                         ((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                           *)this,(uint)bVar6);
          btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
          ::swap(local_38.node,
                 *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                   **)this,alloc);
          btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
          ::delete_leaf_node((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                              *)this,*(node_type **)this);
          *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            **)this = local_38.node;
          *(btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
            **)(this + 8) = local_38.node;
          uVar7 = extraout_RDX;
        }
        else {
          btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
          ::rebalance_or_split
                    ((btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                      *)this,&local_38);
          uVar7 = extraout_RDX_00;
        }
      }
      this_00 = local_38.node;
      if (((ulong)local_38.node & 7) == 0) {
        uVar8 = (ulong)local_38.position;
        uVar3 = (ulong)(byte)local_38.node[10];
        if (uVar8 <= uVar3) {
          for (; uVar8 < uVar3; uVar3 = uVar3 - 1) {
            *(undefined4 *)(local_38.node + uVar3 * 4 + 0xc) =
                 *(undefined4 *)(local_38.node + uVar3 * 4 + 8);
          }
          iVar1 = *args;
          *(int *)(local_38.node + uVar8 * 4 + 0xc) = iVar1;
          bVar2 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                   )((char)local_38.node[10] + 1);
          pbVar4 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                    *)(ulong)CONCAT31((int3)((uint)iVar1 >> 8),bVar2);
          local_38.node[10] = bVar2;
          if (local_38.node[0xb] ==
              (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
               )0x0) {
            uVar8 = uVar8 + 1;
            uVar3 = (ulong)(byte)bVar2;
            if (uVar8 < (byte)bVar2) {
              while ((int)uVar8 < (int)uVar3) {
                uVar7 = (ulong)((int)uVar3 - 1);
                pbVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                         ::child(this_00,uVar7);
                btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                ::set_child(this_00,uVar3,pbVar4);
                uVar3 = uVar7;
              }
              pbVar4 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                        *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_false>_>
                          ::mutable_child(this_00,uVar8);
              uVar7 = extraout_RDX_01;
            }
          }
          *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
          iVar9._8_8_ = uVar7;
          iVar9.node = pbVar4;
          return iVar9;
        }
        __assert_fail("i <= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x852,
                      "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>, Args = <const int &>]"
                     );
      }
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }